

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-legacy.cc
# Opt level: O0

bool __thiscall DataSourceLegacy::load_animation_table(DataSourceLegacy *this,PBuffer *data)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  void *pvVar4;
  unsigned_long *puVar5;
  undefined1 local_6e4 [8];
  Animation a_1;
  size_t j_1;
  vector<Data::Animation,_std::allocator<Data::Animation>_> animations;
  AnimationPhase *anims;
  ulong uStack_6a8;
  int offset;
  size_t i_2;
  size_t b;
  size_t sStack_690;
  int j;
  size_t next;
  size_t a;
  size_t i_1;
  size_t sizes [200];
  ulong local_30;
  size_t i;
  uint32_t *animation_block;
  PBuffer *data_local;
  DataSourceLegacy *this_local;
  
  peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)data)
  ;
  Buffer::set_endianess(peVar3,EndianessBig);
  bVar1 = std::operator==(data,(nullptr_t)0x0);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        data);
    pvVar4 = Buffer::get_data(peVar3);
    for (local_30 = 0; local_30 < 200; local_30 = local_30 + 1) {
      uVar2 = betoh<unsigned_int>(*(uint *)((long)pvVar4 + local_30 * 4));
      *(uint *)((long)pvVar4 + local_30 * 4) = uVar2;
    }
    for (a = 0; a < 200; a = a + 1) {
      next = (size_t)*(uint *)((long)pvVar4 + a * 4);
      peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          data);
      sStack_690 = Buffer::get_size(peVar3);
      for (b._4_4_ = 0; b._4_4_ < 200; b._4_4_ = b._4_4_ + 1) {
        i_2 = (size_t)*(uint *)((long)pvVar4 + (long)b._4_4_ * 4);
        if (next < i_2) {
          puVar5 = std::min<unsigned_long>(&stack0xfffffffffffff970,&i_2);
          sStack_690 = *puVar5;
        }
      }
      sizes[a - 1] = (sStack_690 - next) / 3;
    }
    for (uStack_6a8 = 0; uStack_6a8 < 200; uStack_6a8 = uStack_6a8 + 1) {
      animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)pvVar4 + (long)*(int *)((long)pvVar4 + uStack_6a8 * 4));
      std::vector<Data::Animation,_std::allocator<Data::Animation>_>::vector
                ((vector<Data::Animation,_std::allocator<Data::Animation>_> *)&j_1);
      a_1.x = 0;
      a_1.y = 0;
      for (; (ulong)a_1._4_8_ < sizes[uStack_6a8 - 1]; a_1._4_8_ = a_1._4_8_ + 1) {
        local_6e4[0] = (&(animations.
                          super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->sprite)[a_1._4_8_ * 3]
        ;
        local_6e4._4_4_ =
             SEXT14((char)(&(animations.
                             super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1)
                          [a_1._4_8_ * 3]);
        a_1._0_4_ = SEXT14((char)(&(animations.
                                    super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x2)
                                 [a_1._4_8_ * 3]);
        std::vector<Data::Animation,_std::allocator<Data::Animation>_>::push_back
                  ((vector<Data::Animation,_std::allocator<Data::Animation>_> *)&j_1,
                   (value_type *)local_6e4);
      }
      std::
      vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
      ::push_back(&(this->super_DataSourceBase).animation_table,(value_type *)&j_1);
      std::vector<Data::Animation,_std::allocator<Data::Animation>_>::~vector
                ((vector<Data::Animation,_std::allocator<Data::Animation>_> *)&j_1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
DataSourceLegacy::load_animation_table(PBuffer data) {
  // The serf animation table is stored in big endian order in the data file.
  data->set_endianess(Buffer::EndianessBig);

  // * Starts with 200 uint32s that are offsets from the start
  // of this table to an animation table (one for each animation).
  // * The animation tables are of varying lengths.
  // Each entry in the animation table is three bytes long.
  // First byte is used to determine the serf body sprite.
  // Second byte is a signed horizontal sprite offset.
  // Third byte is a signed vertical offset.

  if (data == nullptr) {
    return false;
  }
  uint32_t *animation_block = reinterpret_cast<uint32_t*>(data->get_data());

  // Endianess convert from big endian.
  for (size_t i = 0; i < 200; i++) {
    animation_block[i] = betoh(animation_block[i]);
  }

  size_t sizes[200];

  for (size_t i = 0; i < 200; i++) {
    size_t a = animation_block[i];
    size_t next = data->get_size();
    for (int j = 0; j < 200; j++) {
      size_t b = animation_block[j];
      if (b > a) {
        next = std::min(next, b);
      }
    }
    sizes[i] = (next - a)/3;
  }

  for (size_t i = 0; i < 200; i++) {
    int offset = animation_block[i];
    AnimationPhase *anims =
    reinterpret_cast<AnimationPhase*>(reinterpret_cast<char*>(animation_block) +
                                      offset);
    std::vector<Data::Animation> animations;
    for (size_t j = 0; j < sizes[i]; j++) {
      Data::Animation a;
      a.sprite = anims[j].sprite;
      a.x = anims[j].x;
      a.y = anims[j].y;
      animations.push_back(a);
    }
    animation_table.push_back(animations);
  }

  return true;
}